

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double cosine_cdf_inv(double cdf,double a,double b)

{
  double dVar1;
  double dVar2;
  double x3;
  double x2;
  double x1;
  double x;
  double tol;
  double r8_pi;
  int it_max;
  int it;
  double cdf3;
  double cdf1;
  double b_local;
  double a_local;
  double cdf_local;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    if ((cdf != 0.0) || (NAN(cdf))) {
      if ((cdf != 1.0) || (NAN(cdf))) {
        x2 = b * -3.141592653589793 + a;
        cdf3 = 0.0;
        x3 = b * 3.141592653589793 + a;
        r8_pi._4_4_ = 1;
        while( true ) {
          if (100 < r8_pi._4_4_) {
            std::operator<<((ostream *)&std::cerr," \n");
            std::operator<<((ostream *)&std::cerr,"COSINE_CDF_INV - Fatal error!\n");
            std::operator<<((ostream *)&std::cerr,"  Iteration limit exceeded.\n");
            exit(1);
          }
          cdf_local = (x2 + x3) * 0.5;
          dVar1 = cosine_cdf(cdf_local,a,b);
          if (ABS(dVar1 - cdf) < 0.0001) break;
          if (((dVar1 <= cdf) && (cdf3 <= cdf)) ||
             ((dVar2 = cdf_local, cdf <= dVar1 && (cdf <= cdf3)))) {
            dVar2 = x3;
            x2 = cdf_local;
            cdf3 = dVar1;
          }
          x3 = dVar2;
          r8_pi._4_4_ = r8_pi._4_4_ + 1;
        }
      }
      else {
        cdf_local = b * 3.141592653589793 + a;
      }
    }
    else {
      cdf_local = b * -3.141592653589793 + a;
    }
    return cdf_local;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"COSINE_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

double cosine_cdf_inv ( double cdf, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    COSINE_CDF_INV inverts the Cosine CDF.
//
//  Discussion:
//
//    A simple bisection method is used on the interval
//    [ A - PI * B, A + PI * B ].
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < B.
//
//    Output, double COSINE_CDF_INV, the corresponding argument of the CDF.
//
{
  double cdf1;
  double cdf3;
  int it;
  int it_max = 100;
  const double r8_pi = 3.14159265358979323;
  double tol = 0.0001;
  double x;
  double x1;
  double x2;
  double x3;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "COSINE_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  if ( cdf == 0.0 )
  {
    x = a - r8_pi * b;
    return x;
  }
  else if ( 1.0 == cdf )
  {
    x = a + r8_pi * b;
    return x;
  }

  x1 = a - r8_pi * b;
  cdf1 = 0.0;

  x2 = a + r8_pi * b;
//
//  Now use bisection.
//
  it = 0;

  for ( it = 1; it <= it_max; it++ )
  {
    x3 = 0.5 * ( x1 + x2 );
    cdf3 = cosine_cdf ( x3, a, b );

    if ( fabs ( cdf3 - cdf ) < tol )
    {
      x = x3;
      return x;
    }

    if ( ( cdf3 <= cdf && cdf1 <= cdf ) || ( cdf <= cdf3 && cdf <= cdf1 ) )
    {
      x1 = x3;
      cdf1 = cdf3;
    }
    else
    {
      x2 = x3;
    }

  }

  cerr << " \n";
  cerr << "COSINE_CDF_INV - Fatal error!\n";
  cerr << "  Iteration limit exceeded.\n";
  exit ( 1 );
}